

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::setCallback(Highs *this,HighsCallbackFunctionType *user_callback,void *user_callback_data)

{
  double *in_RDX;
  HighsCallback *in_RDI;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *unaff_retaddr;
  HighsCallback *__x;
  
  __x = in_RDI;
  HighsCallback::clear(in_RDI);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(unaff_retaddr,&__x->user_callback);
  in_RDI[9].data_out.cutpool_value = in_RDX;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=(unaff_retaddr,&__x->user_callback);
  in_RDI[0xe].data_out.objective_function_value = (double)in_RDI[9].data_out.cutpool_value;
  *(undefined1 *)&in_RDI[0xe].data_out.mip_node_count = 0;
  return kOk;
}

Assistant:

HighsStatus Highs::setCallback(HighsCallbackFunctionType user_callback,
                               void* user_callback_data) {
  this->callback_.clear();
  this->callback_.user_callback = user_callback;
  this->callback_.user_callback_data = user_callback_data;

  options_.log_options.user_callback = this->callback_.user_callback;
  options_.log_options.user_callback_data = this->callback_.user_callback_data;
  options_.log_options.user_callback_active = false;
  return HighsStatus::kOk;
}